

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parsing.h
# Opt level: O0

void __thiscall Parsing::Parsing(Parsing *this)

{
  EVP_PKEY_CTX *in_RSI;
  Parsing *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::vector<int,_std::allocator<int>_>::vector(&this->contentLine);
  std::vector<int,_std::allocator<int>_>::vector(&this->contentRow);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->reservationWords);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->divisionWords);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->operationWords);
  std::vector<Word,_std::allocator<Word>_>::vector(&this->words);
  this->identifierBase = 0;
  this->constBase = 0;
  this->operationBase = 0;
  this->divisionBase = 0;
  this->reservationBase = 0;
  init(this,in_RSI);
  return;
}

Assistant:

Parsing() {
	    reservationBase = divisionBase = operationBase = \
	    constBase = identifierBase = 0;
		init();
    }